

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_convert.cpp
# Opt level: O3

string * Potassco::xconvert(string *out,unsigned_long n)

{
  string *psVar1;
  anon_union_64_3_812e3e79_for_StringBuilder_0 local_48;
  
  if (n != 0xffffffffffffffff) {
    local_48.sbo_[0x3f] = '@';
    local_48.str_ = out;
    StringBuilder::append_((StringBuilder *)&local_48.buf_,n,true);
    StringBuilder::~StringBuilder((StringBuilder *)&local_48.buf_);
    return out;
  }
  psVar1 = (string *)std::__cxx11::string::append((char *)out);
  return psVar1;
}

Assistant:

string& xconvert(string& out, unsigned long n) {
	return n != static_cast<unsigned long>(-1) ? (StringBuilder(out).append(n), out) : out.append("umax");
}